

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visitRefTest
          (Flow *__return_storage_ptr__,
          ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner> *this,RefTest *curr)

{
  SmallVector<wasm::Literal,_1UL> *pSVar1;
  char cVar2;
  uchar uVar3;
  anon_union_16_6_1532cd5a_for_Literal_0 local_180;
  undefined8 local_170;
  SmallVector<wasm::Literal,_1UL> local_168;
  pointer local_130;
  size_t sStack_128;
  undefined1 local_120 [8];
  Cast cast;
  Flow ref;
  Literal val;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_68;
  pointer local_50;
  size_t sStack_48;
  Literal local_40;
  
  visit((Flow *)&cast.state.
                 super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 ._M_index,this,*(Expression **)(curr + 0x10));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 +
        cast.state.
        super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        .
        super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
        ._72_8_ != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    wasm::Literal::Literal((Literal *)&ref.breakTo.super_IString.str._M_str,(Literal *)&ref);
    cVar2 = wasm::Type::isSubType
                      ((Type)val.field_0.gcData.
                             super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(Type)*(uintptr_t *)(curr + 0x18));
    if (cVar2 == '\0') {
      wasm::Literal::Literal(&local_40,(Literal *)&ref.breakTo.super_IString.str._M_str);
      wasm::Literal::Literal((Literal *)&local_168,&local_40);
      uVar3 = '\x02';
      wasm::Literal::Literal((Literal *)local_120,(Literal *)&local_168);
    }
    else {
      wasm::Literal::Literal(&local_40,(Literal *)&ref.breakTo.super_IString.str._M_str);
      wasm::Literal::Literal((Literal *)&local_168,&local_40);
      uVar3 = '\x01';
      wasm::Literal::Literal((Literal *)local_120,(Literal *)&local_168);
    }
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._M_first._M_storage._M_storage[0x40] = uVar3;
    wasm::Literal::~Literal((Literal *)&local_168);
    wasm::Literal::~Literal(&local_40);
    pSVar1 = (SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str;
  }
  else {
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_168,
               (SmallVector<wasm::Literal,_1UL> *)
               &cast.state.
                super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                ._M_index);
    local_130 = ref.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    sStack_128 = ref.breakTo.super_IString.str._M_len;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str,&local_168);
    local_50 = local_130;
    sStack_48 = sStack_128;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)local_120,
               (SmallVector<wasm::Literal,_1UL> *)&ref.breakTo.super_IString.str._M_str);
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._48_8_ = local_50;
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._56_8_ = sStack_48;
    cast.state.
    super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    .
    super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
    ._M_u._M_first._M_storage._M_storage[0x40] = '\0';
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_68);
    wasm::Literal::~Literal(&val);
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_168.flexible);
    pSVar1 = &local_168;
  }
  wasm::Literal::~Literal((pSVar1->fixed)._M_elems);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ref.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ref);
  if (cast.state.
      super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      .
      super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
      ._M_u._M_first._M_storage._M_storage[0x40] == '\0') {
    SmallVector<wasm::Literal,_1UL>::SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__,
               (SmallVector<wasm::Literal,_1UL> *)local_120);
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         cast.state.
         super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         .
         super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
         ._M_u._48_8_;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)cast.state.
                 super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 .
                 super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                 ._M_u._56_8_;
  }
  else {
    local_180.i32 =
         (int32_t)(cast.state.
                   super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                   .
                   super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                   .
                   super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                   .
                   super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                   .
                   super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                   .
                   super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                   ._M_u._M_first._M_storage._M_storage[0x40] == '\x01');
    local_170 = 2;
    Flow::Flow(__return_storage_ptr__,(Literal *)&local_180.func);
    wasm::Literal::~Literal((Literal *)&local_180.func);
  }
  if ((long)(char)cast.state.
                  super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  .
                  super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                  ._M_u._M_first._M_storage._M_storage[0x40] != -1) {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>_&>
      ::_S_vtable._M_arr
      [(char)cast.state.
             super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             .
             super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
             ._M_u._M_first._M_storage._M_storage[0x40]]._M_data)
              ((anon_class_1_0_00000001 *)
               &cast.state.
                super__Variant_base<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Move_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Copy_assign_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Move_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Copy_ctor_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                .
                super__Variant_storage_alias<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                ._M_index,
               (variant<wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Breaking,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Success,_wasm::ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::Cast::Failure>
                *)local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefTest(RefTest* curr) {
    NOTE_ENTER("RefTest");
    auto cast = doCast(curr);
    if (auto* breaking = cast.getBreaking()) {
      return *breaking;
    } else {
      return Literal(int32_t(bool(cast.getSuccess())));
    }
  }